

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall QSQLiteDriver::subscribeToNotification(QSQLiteDriver *this,QString *name)

{
  QList *this_00;
  long lVar1;
  char cVar2;
  QStringView QVar3;
  
  lVar1 = *(long *)(this + 8);
  cVar2 = (**(code **)(*(long *)this + 0x60))();
  if (cVar2 == '\0') {
    lcSqlite();
    if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      subscribeToNotification();
    }
  }
  else {
    this_00 = (QList *)(lVar1 + 200);
    QVar3.m_data = (name->d).ptr;
    QVar3.m_size = (name->d).size;
    cVar2 = QtPrivate::QStringList_contains(this_00,QVar3,CaseSensitive);
    if (cVar2 == '\0') {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this_00,*(qsizetype *)(lVar1 + 0xd8),name);
      QList<QString>::end((QList<QString> *)this_00);
      if (*(long *)(lVar1 + 0xd8) != 1) {
        return true;
      }
      sqlite3_update_hook(*(sqlite3 **)(lVar1 + 0xa8),handle_sqlite_callback,this);
      return true;
    }
    lcSqlite();
    if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      subscribeToNotification();
    }
  }
  return false;
}

Assistant:

bool QSQLiteDriver::subscribeToNotification(const QString &name)
{
    Q_D(QSQLiteDriver);
    if (!isOpen()) {
        qCWarning(lcSqlite, "QSQLiteDriver::subscribeToNotification: Database not open.");
        return false;
    }

    if (d->notificationid.contains(name)) {
        qCWarning(lcSqlite, "QSQLiteDriver::subscribeToNotification: Already subscribing to '%ls'.",
                  qUtf16Printable(name));
        return false;
    }

    //sqlite supports only one notification callback, so only the first is registered
    d->notificationid << name;
    if (d->notificationid.size() == 1)
        sqlite3_update_hook(d->access, &handle_sqlite_callback, reinterpret_cast<void *> (this));

    return true;
}